

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall RegVmLoweredFunction::FreeConstantRegisters(RegVmLoweredFunction *this)

{
  uint uVar1;
  uchar *puVar2;
  uint local_14;
  uint i;
  RegVmLoweredFunction *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = SmallArray<unsigned_char,_16U>::size(&this->constantRegisters);
    if (uVar1 <= local_14) break;
    puVar2 = SmallArray<unsigned_char,_16U>::operator[](&this->constantRegisters,local_14);
    FreeRegister(this,*puVar2);
    local_14 = local_14 + 1;
  }
  SmallArray<unsigned_char,_16U>::clear(&this->constantRegisters);
  return;
}

Assistant:

void RegVmLoweredFunction::FreeConstantRegisters()
{
	for(unsigned i = 0; i < constantRegisters.size(); i++)
		FreeRegister(constantRegisters[i]);

	constantRegisters.clear();
}